

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

void __thiscall
gl4cts::FunctionObject::unary<double,_tcu::Matrix<double,_3,_3>_>::call
          (unary<double,_tcu::Matrix<double,_3,_3>_> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  Matrix<double,_3,_3> arg;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48 [8];
  
  puVar6 = &local_58;
  local_48[4] = 0;
  local_48[5] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48[6] = 0;
  lVar7 = 0;
  lVar8 = 0;
  do {
    lVar9 = 0;
    do {
      uVar10 = 0x3ff00000;
      if (lVar7 != lVar9) {
        uVar10 = 0;
      }
      *(ulong *)((long)puVar6 + lVar9) = (ulong)uVar10 << 0x20;
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x48);
    lVar8 = lVar8 + 1;
    puVar6 = (undefined8 *)((long)puVar6 + 8);
    lVar7 = lVar7 + 0x18;
  } while (lVar8 != 3);
  lVar7 = 0;
  do {
    *(undefined8 *)((long)local_48 + lVar7) = *(undefined8 *)((long)argument_src + lVar7 + 0x10);
    puVar1 = (undefined4 *)((long)argument_src + lVar7);
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    *(undefined4 *)((long)&local_58 + lVar7) = *puVar1;
    *(undefined4 *)((long)&local_58 + lVar7 + 4) = uVar3;
    *(undefined4 *)((long)&uStack_50 + lVar7) = uVar4;
    *(undefined4 *)((long)&uStack_50 + lVar7 + 4) = uVar5;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x48);
  uVar2 = (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&local_58);
  *(undefined8 *)result_dst = uVar2;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}